

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void cxxopts::values::stringstream_parser<double>(string *text,double *value)

{
  stringstream in;
  long local_1a0 [4];
  byte abStack_180 [96];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0,(string *)text,_S_out|_S_in);
  std::istream::_M_extract<double>((double *)local_1a0);
  if ((abStack_180[*(long *)(local_1a0[0] + -0x18)] & 5) != 0) {
    throw_or_mimic<cxxopts::argument_incorrect_type>(text);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void stringstream_parser(const std::string& text, T& value)
    {
      std::stringstream in(text);
      in >> value;
      if (!in) {
        throw_or_mimic<argument_incorrect_type>(text);
      }
    }